

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterTests.cpp
# Opt level: O3

void addMeanSquareError<CoreML::Specification::NeuralNetwork>
               (Model *m,NeuralNetwork *nn,char *lossName,char *mseInputName,char *targetName)

{
  string *psVar1;
  NetworkUpdateParameters *this;
  Type *this_00;
  MeanSquaredErrorLossLayer *this_01;
  LogMessage *other;
  Type *this_02;
  ModelDescription *pMVar2;
  FeatureDescription output;
  LogFinisher local_99;
  FeatureDescription local_98;
  LogMessage local_68;
  
  this = nn->updateparams_;
  if (this == (NetworkUpdateParameters *)0x0) {
    this = (NetworkUpdateParameters *)operator_new(0x50);
    CoreML::Specification::NetworkUpdateParameters::NetworkUpdateParameters(this);
    nn->updateparams_ = this;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LossLayer>::TypeHandler>
                      (&(this->losslayers_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::LossLayer::set_name(this_00,lossName);
  if (this_00->_oneof_case_[0] == 0xb) {
    this_01 = (this_00->LossLayerType_).meansquarederrorlosslayer_;
  }
  else {
    CoreML::Specification::LossLayer::clear_LossLayerType(this_00);
    this_00->_oneof_case_[0] = 0xb;
    this_01 = (MeanSquaredErrorLossLayer *)operator_new(0x28);
    CoreML::Specification::MeanSquaredErrorLossLayer::MeanSquaredErrorLossLayer(this_01);
    (this_00->LossLayerType_).meansquarederrorlosslayer_ = this_01;
  }
  CoreML::Specification::MeanSquaredErrorLossLayer::set_input(this_01,mseInputName);
  CoreML::Specification::MeanSquaredErrorLossLayer::set_target(this_01,targetName);
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  if ((pMVar2->output_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_68,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_99,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  CoreML::Specification::FeatureDescription::FeatureDescription
            (&local_98,
             (FeatureDescription *)((pMVar2->output_).super_RepeatedPtrFieldBase.rep_)->elements[0])
  ;
  pMVar2 = m->description_;
  if (pMVar2 == (ModelDescription *)0x0) {
    pMVar2 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar2);
    m->description_ = pMVar2;
  }
  this_02 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar2->traininginput_).super_RepeatedPtrFieldBase,(Type *)0x0);
  CoreML::Specification::FeatureDescription::CopyFrom(this_02,&local_98);
  psVar1 = (this_02->name_).ptr_;
  if (psVar1 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&this_02->name_,(this_01->target_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar1);
  }
  CoreML::Specification::FeatureDescription::~FeatureDescription(&local_98);
  return;
}

Assistant:

void addMeanSquareError(Specification::Model& m, NeuralNetworkClass *nn, const char *lossName, const char *mseInputName, const char *targetName) {

    // set a MSE loss layer
    Specification::NetworkUpdateParameters *updateParams = nn->mutable_updateparams();
    Specification::LossLayer *lossLayer = updateParams->add_losslayers();
    lossLayer->set_name(lossName);
    Specification::MeanSquaredErrorLossLayer *mseLossLayer = lossLayer->mutable_meansquarederrorlosslayer();
    mseLossLayer->set_input(mseInputName);
    mseLossLayer->set_target(targetName);

    auto output = m.description().output(0);
    auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
    trainingInput->CopyFrom(output);
    trainingInput->set_name(mseLossLayer->target());

}